

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-connect-error.c
# Opt level: O2

int run_test_pipe_connect_to_file(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  int64_t eval_b;
  int64_t eval_b_1;
  uv_connect_t req;
  uv_pipe_t client;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar2,&client,0);
  eval_b = (int64_t)iVar1;
  req.data = (void *)eval_b;
  if ((void *)eval_b == (void *)0x0) {
    uv_pipe_connect(&req,&client,"test/fixtures/empty_file",connect_cb_file);
    puVar2 = uv_default_loop();
    uv_run(puVar2,UV_RUN_DEFAULT);
    eval_b = 1;
    lVar3 = (long)close_cb_called;
    if (lVar3 == 1) {
      eval_b = 1;
      lVar3 = (long)connect_cb_called;
      if (lVar3 == 1) {
        puVar2 = uv_default_loop();
        close_loop(puVar2);
        eval_b = 0;
        puVar2 = uv_default_loop();
        iVar1 = uv_loop_close(puVar2);
        lVar3 = (long)iVar1;
        if (lVar3 == 0) {
          uv_library_shutdown();
          return 0;
        }
        pcVar5 = "uv_loop_close(uv_default_loop())";
        pcVar4 = "0";
        uVar6 = 0x67;
      }
      else {
        pcVar5 = "connect_cb_called";
        pcVar4 = "1";
        uVar6 = 0x65;
      }
    }
    else {
      pcVar5 = "close_cb_called";
      pcVar4 = "1";
      uVar6 = 100;
    }
  }
  else {
    pcVar5 = "0";
    pcVar4 = "r";
    uVar6 = 0x5f;
    lVar3 = 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-connect-error.c"
          ,uVar6,pcVar4,"==",pcVar5,eval_b,"==",lVar3);
  abort();
}

Assistant:

TEST_IMPL(pipe_connect_to_file) {
  const char* path = "test/fixtures/empty_file";
  uv_pipe_t client;
  uv_connect_t req;
  int r;

  r = uv_pipe_init(uv_default_loop(), &client, 0);
  ASSERT_OK(r);
  uv_pipe_connect(&req, &client, path, connect_cb_file);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);
  ASSERT_EQ(1, connect_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}